

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

UnconnectedDriveDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnconnectedDriveDirectiveSyntax,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  UnconnectedDriveDirectiveSyntax *pUVar11;
  
  pUVar11 = (UnconnectedDriveDirectiveSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UnconnectedDriveDirectiveSyntax *)this->endPtr < pUVar11 + 1) {
    pUVar11 = (UnconnectedDriveDirectiveSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pUVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pUVar11->super_DirectiveSyntax).super_SyntaxNode.kind = UnconnectedDriveDirective;
  (pUVar11->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pUVar11->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pUVar11->super_DirectiveSyntax).directive.kind = TVar3;
  (pUVar11->super_DirectiveSyntax).directive.field_0x2 = uVar4;
  (pUVar11->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar5.raw;
  (pUVar11->super_DirectiveSyntax).directive.rawLen = uVar6;
  (pUVar11->super_DirectiveSyntax).directive.info = pIVar1;
  (pUVar11->strength).kind = TVar7;
  (pUVar11->strength).field_0x2 = uVar8;
  (pUVar11->strength).numFlags = (NumericTokenFlags)NVar9.raw;
  (pUVar11->strength).rawLen = uVar10;
  (pUVar11->strength).info = pIVar2;
  return pUVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }